

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonevector.cpp
# Opt level: O3

Error __thiscall
asmjit::v1_14::ZoneVectorBase::_growingReserve
          (ZoneVectorBase *this,ZoneAllocator *allocator,uint32_t sizeOfT,uint32_t n)

{
  Error EVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (n <= this->_capacity) {
    return 0;
  }
  uVar3 = (ulong)sizeOfT;
  uVar4 = this->_capacity * uVar3;
  uVar2 = n * uVar3;
  uVar5 = 0x20;
  if (((0x1f < uVar4) && (uVar5 = 0x80, 0x7f < uVar4)) && (uVar5 = 0x200, 0x200 < uVar4)) {
    uVar5 = uVar4;
  }
  if (uVar5 < uVar2) {
    uVar5 = uVar2 - 1 >> 1 | uVar2 - 1;
    uVar5 = uVar5 >> 2 | uVar5;
    uVar5 = uVar5 >> 4 | uVar5;
    uVar5 = uVar5 >> 8 | uVar5;
    uVar5 = uVar5 >> 0x10 | uVar5;
    uVar5 = (uVar5 >> 0x20 | uVar5) + 1;
    uVar4 = (ulong)n;
    if (uVar5 < uVar2) goto LAB_0012b149;
    if (0x1000000 < uVar5) {
      uVar5 = ((uint)uVar2 & 0xffffff) + uVar2;
    }
  }
  uVar4 = 0xffffffff;
  if (uVar5 / uVar3 < 0xffffffff) {
    uVar4 = uVar5 / uVar3;
  }
LAB_0012b149:
  EVar1 = _reserve(this,allocator,sizeOfT,(uint32_t)uVar4);
  return EVar1;
}

Assistant:

Error ZoneVectorBase::_growingReserve(ZoneAllocator* allocator, uint32_t sizeOfT, uint32_t n) noexcept {
  uint32_t capacity = _capacity;
  if (capacity >= n)
    return kErrorOk;
  return _reserve(allocator, sizeOfT, ZoneVector_growCapacity(capacity, n, sizeOfT));
}